

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmModule * CompileVm(ExpressionContext *ctx,ExprBase *expression,char *code)

{
  uint uVar1;
  VariableData *pVVar2;
  VariableData **ppVVar3;
  TypeBase **ppTVar4;
  FunctionData *pFVar5;
  Allocator *allocator;
  FunctionData **ppFVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  VmFunction *this_00;
  VmFunction *this_01;
  ScopeData *pSVar9;
  VmBlock *block;
  ulong uVar10;
  ulong uVar11;
  ExprBase *expression_00;
  SynBase *pSVar12;
  VmType type;
  VmType returnType;
  TraceScope traceScope;
  TraceScope local_40;
  VmModule *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if ((CompileVm(ExpressionContext&,ExprBase*,char_const*)::token == '\0') &&
     (iVar8 = __cxa_guard_acquire(&CompileVm(ExpressionContext&,ExprBase*,char_const*)::token),
     iVar8 != 0)) {
    CompileVm::token = NULLC::TraceGetToken("InstructionTreeVm","CompileVm");
    __cxa_guard_release(&CompileVm(ExpressionContext&,ExprBase*,char_const*)::token);
  }
  NULLC::TraceScope::TraceScope(&local_40,CompileVm::token);
  if ((expression == (ExprBase *)0x0) || (expression->typeID != 0x38)) {
    expression = (ExprBase *)0x0;
  }
  if (expression == (ExprBase *)0x0) {
    this = (VmModule *)0x0;
  }
  else {
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x15c0);
    this = (VmModule *)CONCAT44(extraout_var,iVar8);
    VmModule::VmModule(this,ctx->allocator,code);
    iVar8 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x170);
    this_00 = (VmFunction *)CONCAT44(extraout_var_00,iVar8);
    VmFunction::VmFunction
              (this_00,this->allocator,(VmType)ZEXT816(0),expression->source,(FunctionData *)0x0,
               (ScopeData *)expression[1]._vptr_ExprBase,(VmType)ZEXT816(0));
    pSVar9 = this_00->scope;
    if ((pSVar9->allVariables).count != 0) {
      uVar11 = 0;
      do {
        pVVar2 = (pSVar9->allVariables).data[uVar11];
        if (pVVar2->isAlloca == true) {
          uVar1 = (this_00->allocas).count;
          if (uVar1 == (this_00->allocas).max) {
            SmallArray<VariableData_*,_4U>::grow(&this_00->allocas,uVar1);
          }
          ppVVar3 = (this_00->allocas).data;
          if (ppVVar3 == (VariableData **)0x0) {
LAB_001b49de:
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,
                          "void SmallArray<VariableData *, 4>::push_back(const T &) [T = VariableData *, N = 4]"
                         );
          }
          uVar1 = (this_00->allocas).count;
          (this_00->allocas).count = uVar1 + 1;
          ppVVar3[uVar1] = pVVar2;
        }
        uVar11 = uVar11 + 1;
        pSVar9 = this_00->scope;
      } while (uVar11 < (pSVar9->allVariables).count);
    }
    uVar11 = (ulong)(ctx->types).count;
    if (uVar11 != 0) {
      ppTVar4 = (ctx->types).data;
      uVar10 = 0;
      do {
        ppTVar4[uVar10]->typeIndex = (uint)uVar10;
        uVar10 = uVar10 + 1;
      } while (uVar11 != uVar10);
    }
    uVar1 = (ctx->functions).count;
    uVar11 = (ulong)uVar1;
    if (uVar1 != 0) {
      uVar10 = 0;
      do {
        pFVar5 = (ctx->functions).data[uVar10];
        bVar7 = ExpressionContext::IsGenericFunction(ctx,pFVar5);
        if ((!bVar7) &&
           (((pFVar5->isPrototype != true || (pFVar5->implementation == (FunctionData *)0x0)) &&
            (pFVar5->vmFunction == (VmFunction *)0x0)))) {
          iVar8 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x170);
          this_01 = (VmFunction *)CONCAT44(extraout_var_01,iVar8);
          allocator = this->allocator;
          type = GetVmType(ctx,ctx->typeFunctionID);
          pSVar12 = pFVar5->source;
          pSVar9 = pFVar5->functionScope;
          returnType = GetVmType(ctx,pFVar5->type->returnType);
          VmFunction::VmFunction(this_01,allocator,type,pSVar12,pFVar5,pSVar9,returnType);
          pSVar9 = this_01->scope;
          if ((pSVar9->allVariables).count != 0) {
            uVar11 = 0;
            do {
              pVVar2 = (pSVar9->allVariables).data[uVar11];
              if (pVVar2->isAlloca == true) {
                uVar1 = (this_01->allocas).count;
                if (uVar1 == (this_01->allocas).max) {
                  SmallArray<VariableData_*,_4U>::grow(&this_01->allocas,uVar1);
                }
                ppVVar3 = (this_01->allocas).data;
                if (ppVVar3 == (VariableData **)0x0) goto LAB_001b49de;
                uVar1 = (this_01->allocas).count;
                (this_01->allocas).count = uVar1 + 1;
                ppVVar3[uVar1] = pVVar2;
              }
              uVar11 = uVar11 + 1;
              pSVar9 = this_01->scope;
            } while (uVar11 < (pSVar9->allVariables).count);
          }
          pFVar5->vmFunction = this_01;
          IntrusiveList<VmFunction>::push_back(&this->functions,this_01);
        }
        uVar10 = uVar10 + 1;
        uVar11 = (ulong)(ctx->functions).count;
      } while (uVar10 < uVar11);
    }
    if ((int)uVar11 != 0) {
      ppFVar6 = (ctx->functions).data;
      uVar10 = 0;
      do {
        pFVar5 = ppFVar6[uVar10];
        if ((pFVar5->isPrototype == true) && (pFVar5->implementation != (FunctionData *)0x0)) {
          pFVar5->vmFunction = pFVar5->implementation->vmFunction;
        }
        uVar10 = uVar10 + 1;
      } while (uVar11 != uVar10);
    }
    if (*(int *)&expression[1].source != 0) {
      uVar11 = 0;
      do {
        CompileVm(ctx,this,*(ExprBase **)(*(long *)&expression[1].typeID + uVar11 * 8));
        uVar11 = uVar11 + 1;
      } while (uVar11 < *(uint *)&expression[1].source);
    }
    this->skipFunctionDefinitions = true;
    this->currentFunction = this_00;
    block = anon_unknown.dwarf_13465d::CreateBlock(this,expression->source,"start");
    VmFunction::AddBlock(this_00,block);
    this->currentBlock = block;
    VmValue::AddUse(&block->super_VmValue,(VmValue *)this_00);
    for (expression_00 = (ExprBase *)expression[7]._vptr_ExprBase; expression_00 != (ExprBase *)0x0;
        expression_00 = expression_00->next) {
      CompileVm(ctx,this,expression_00);
    }
    for (pSVar12 = expression[7].source; pSVar12 != (SynBase *)0x0;
        pSVar12 = (SynBase *)(pSVar12->pos).begin) {
      CompileVm(ctx,this,(ExprBase *)pSVar12);
    }
    IntrusiveList<VmFunction>::push_back(&this->functions,this_00);
    this->currentFunction = (VmFunction *)0x0;
    this->currentBlock = (VmBlock *)0x0;
  }
  NULLC::TraceScope::~TraceScope(&local_40);
  return this;
}

Assistant:

VmModule* CompileVm(ExpressionContext &ctx, ExprBase *expression, const char *code)
{
	TRACE_SCOPE("InstructionTreeVm", "CompileVm");

	if(ExprModule *node = getType<ExprModule>(expression))
	{
		VmModule *module = new (ctx.get<VmModule>()) VmModule(ctx.allocator, code);

		// Generate global function
		VmFunction *global = new (module->get<VmFunction>()) VmFunction(module->allocator, VmType::Void, node->source, NULL, node->moduleScope, VmType::Void);

		for(unsigned k = 0; k < global->scope->allVariables.size(); k++)
		{
			VariableData *variable = global->scope->allVariables[k];

			if(variable->isAlloca)
				global->allocas.push_back(variable);
		}

		// Generate type indexes
		for(unsigned i = 0; i < ctx.types.size(); i++)
			ctx.types[i]->typeIndex = i;

		// Generate VmFunction object for each function
		for(unsigned i = 0; i < ctx.functions.size(); i++)
		{
			FunctionData *function = ctx.functions[i];

			if(ctx.IsGenericFunction(function))
				continue;

			// Skip prototypes that will have an implementation later
			if(function->isPrototype && function->implementation)
				continue;

			if(function->vmFunction)
				continue;

			VmFunction *vmFunction = new (module->get<VmFunction>()) VmFunction(module->allocator, GetVmType(ctx, ctx.typeFunctionID), function->source, function, function->functionScope, GetVmType(ctx, function->type->returnType));

			for(unsigned k = 0; k < vmFunction->scope->allVariables.size(); k++)
			{
				VariableData *variable = vmFunction->scope->allVariables[k];

				if(variable->isAlloca)
					vmFunction->allocas.push_back(variable);
			}

			function->vmFunction = vmFunction;

			module->functions.push_back(vmFunction);
		}

		for(unsigned i = 0; i < ctx.functions.size(); i++)
		{
			FunctionData *function = ctx.functions[i];

			if(function->isPrototype && function->implementation)
				function->vmFunction = function->implementation->vmFunction;
		}

		for(unsigned i = 0; i < node->definitions.size(); i++)
			CompileVm(ctx, module, node->definitions[i]);

		module->skipFunctionDefinitions = true;

		// Setup global function
		module->currentFunction = global;

		VmBlock *block = CreateBlock(module, node->source, "start");

		global->AddBlock(block);
		module->currentBlock = block;
		block->AddUse(global);

		for(ExprBase *value = node->setup.head; value; value = value->next)
			CompileVm(ctx, module, value);

		for(ExprBase *value = node->expressions.head; value; value = value->next)
			CompileVm(ctx, module, value);

		module->functions.push_back(global);

		module->currentFunction = NULL;
		module->currentBlock = NULL;

		return module;
	}

	return NULL;
}